

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

string * fileContents(string *__return_storage_ptr__,string *fileName)

{
  stringstream buffer;
  undefined1 local_390 [376];
  ifstream file;
  streambuf local_208 [504];
  
  resourcePath((string *)&buffer,fileName);
  std::ifstream::ifstream(&file,(string *)&buffer,_S_in);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_390,local_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContents(const std::string &fileName)
{
    std::ifstream file(resourcePath(fileName));
    std::stringstream buffer;

    buffer << file.rdbuf();

    return buffer.str();
}